

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singledocparser.cpp
# Opt level: O3

void __thiscall
YAML::SingleDocParser::SingleDocParser
          (SingleDocParser *this,Scanner *scanner,Directives *directives)

{
  _Rb_tree_header *p_Var1;
  _Deque_base<YAML::CollectionType::value,_std::allocator<YAML::CollectionType::value>_> *this_00;
  
  this->depth = 0;
  this->m_scanner = scanner;
  this->m_directives = directives;
  this_00 = (_Deque_base<YAML::CollectionType::value,_std::allocator<YAML::CollectionType::value>_>
             *)operator_new(0x50);
  (this_00->_M_impl).super__Deque_impl_data._M_map = 0;
  *(size_t *)((long)&(this_00->_M_impl).super__Deque_impl_data + 8) = 0;
  ((iterator *)((long)&(this_00->_M_impl).super__Deque_impl_data + 0x10))->_M_cur =
       (_Elt_pointer)0x0;
  *(_Elt_pointer *)((long)&(this_00->_M_impl).super__Deque_impl_data + 0x18) = (_Elt_pointer)0x0;
  *(_Elt_pointer *)((long)&(this_00->_M_impl).super__Deque_impl_data + 0x20) = (_Elt_pointer)0x0;
  *(_Map_pointer *)((long)&(this_00->_M_impl).super__Deque_impl_data + 0x28) = (_Map_pointer)0x0;
  ((iterator *)((long)&(this_00->_M_impl).super__Deque_impl_data + 0x30))->_M_cur =
       (_Elt_pointer)0x0;
  *(_Elt_pointer *)((long)&(this_00->_M_impl).super__Deque_impl_data + 0x38) = (_Elt_pointer)0x0;
  *(_Elt_pointer *)((long)&(this_00->_M_impl).super__Deque_impl_data + 0x40) = (_Elt_pointer)0x0;
  *(_Map_pointer *)((long)&(this_00->_M_impl).super__Deque_impl_data + 0x48) = (_Map_pointer)0x0;
  std::_Deque_base<YAML::CollectionType::value,_std::allocator<YAML::CollectionType::value>_>::
  _M_initialize_map(this_00,0);
  (this->m_pCollectionStack)._M_t.
  super___uniq_ptr_impl<YAML::CollectionStack,_std::default_delete<YAML::CollectionStack>_>._M_t.
  super__Tuple_impl<0UL,_YAML::CollectionStack_*,_std::default_delete<YAML::CollectionStack>_>.
  super__Head_base<0UL,_YAML::CollectionStack_*,_false>._M_head_impl = (CollectionStack *)this_00;
  p_Var1 = &(this->m_anchors)._M_t._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(this->m_anchors)._M_t._M_impl = 0;
  *(undefined8 *)&(this->m_anchors)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->m_anchors)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_anchors)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_anchors)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_anchors)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_curAnchor = 0;
  return;
}

Assistant:

SingleDocParser::SingleDocParser(Scanner& scanner, const Directives& directives)
    : m_scanner(scanner),
      m_directives(directives),
      m_pCollectionStack(new CollectionStack),
      m_anchors{},
      m_curAnchor(0) {}